

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int iVar1;
  int iVar2;
  stbi__context *__src;
  stbi_uc *psVar3;
  int *piVar4;
  undefined8 *puVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  size_t __size;
  int iVar10;
  uchar *image;
  uchar *local_89b0;
  size_t local_8998;
  stbi__context s;
  stbi__gif local_88a0;
  
  s.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  s.read_from_callbacks = 0;
  s.callback_already_read = 0;
  s.img_buffer_end = buffer + len;
  piVar7 = y;
  s.img_buffer = buffer;
  s.img_buffer_original = buffer;
  s.img_buffer_original_end = s.img_buffer_end;
  iVar2 = stbi__gif_test(&s);
  if (iVar2 == 0) {
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
    *puVar5 = "not GIF";
    local_89b0 = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_8998 = 4;
    lVar8 = 0;
    local_89b0 = (uchar *)0x0;
    lVar6 = 0;
    while( true ) {
      __src = (stbi__context *)stbi__gif_load_next(&s,&local_88a0,comp,(int)lVar6,(stbi_uc *)piVar7)
      ;
      iVar2 = (int)lVar8;
      if ((__src == &s) || (__src == (stbi__context *)0x0)) break;
      *x = local_88a0.w;
      *y = local_88a0.h;
      iVar9 = local_88a0.h * local_88a0.w;
      iVar1 = iVar9 * 4;
      __size = (size_t)((iVar2 + 1) * iVar1);
      if (local_89b0 == (uchar *)0x0) {
        local_89b0 = (uchar *)malloc(__size);
        if (local_89b0 != (stbi_uc *)0x0) {
          if (delays != (int **)0x0) {
            piVar4 = (int *)malloc(local_8998);
            *delays = piVar4;
            if (piVar4 == (int *)0x0) goto LAB_00132ebc;
          }
          goto LAB_00132dbf;
        }
        stbi__load_gif_main_outofmem(&local_88a0,(stbi_uc *)0x0,delays);
LAB_00132ee9:
        local_89b0 = (uchar *)0x0;
        goto LAB_00132eee;
      }
      psVar3 = (stbi_uc *)realloc(local_89b0,__size);
      if (psVar3 == (stbi_uc *)0x0) {
LAB_00132ebc:
        stbi__load_gif_main_outofmem(&local_88a0,local_89b0,delays);
        goto LAB_00132ee9;
      }
      local_89b0 = psVar3;
      if (delays != (int **)0x0) {
        piVar4 = (int *)realloc(*delays,local_8998);
        if (piVar4 == (int *)0x0) goto LAB_00132ebc;
        *delays = piVar4;
      }
LAB_00132dbf:
      memcpy(local_89b0 + iVar2 * iVar1,__src,(long)iVar1);
      if (lVar8 != 0) {
        lVar6 = (long)local_89b0 - (long)(iVar9 * 8);
      }
      if (delays != (int **)0x0) {
        (*delays)[lVar8] = local_88a0.delay;
      }
      local_8998 = local_8998 + 4;
      lVar8 = lVar8 + 1;
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89b0 = stbi__convert_format(local_89b0,4,req_comp,local_88a0.w * iVar2,local_88a0.h);
    }
    *z = iVar2;
  }
LAB_00132eee:
  lVar6 = __tls_get_addr(&PTR_0016bd50);
  piVar7 = &stbi__vertically_flip_on_load_global;
  if (*(int *)(lVar6 + 0xc) != 0) {
    piVar7 = (int *)(lVar6 + 8);
  }
  if (*piVar7 != 0) {
    iVar2 = *x;
    iVar1 = *y;
    iVar9 = *comp;
    image = local_89b0;
    iVar10 = 0;
    if (0 < *z) {
      iVar10 = *z;
    }
    while (iVar10 != 0) {
      stbi__vertical_flip(image,iVar2,iVar1,iVar9);
      image = image + iVar1 * iVar2 * iVar9;
      iVar10 = iVar10 + -1;
    }
  }
  return local_89b0;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}